

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  normal_distribution<float> *this;
  MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  *m;
  Jacobian<Measurement,_Measurement> *m_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  State *pSVar8;
  ostream *poVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  result_type rVar13;
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> local_2e0;
  undefined8 local_234;
  undefined8 uStack_22c;
  undefined8 local_224;
  undefined8 uStack_21c;
  undefined4 local_214;
  SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> local_210;
  undefined8 local_198;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> predictor;
  OrientationModel om;
  PositionModel pm;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> ekf;
  normal_distribution<float> noise;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_58;
  Control<float> local_4c;
  Control u;
  OrientationMeasurement orientation;
  float local_38;
  float local_34;
  
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._44_4_ = 0x3f800000;
  local_210._48_8_ = 0;
  local_210._56_8_ = 0x3f80000000000000;
  local_210._64_8_ = 0;
  local_210._72_8_ = 0x3f80000000000000;
  local_210.W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = 1.0;
  local_210.W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  local_210.W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
       = 0.0;
  local_210.W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
       = 0.0;
  local_210.W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
       = 1.0;
  local_210.W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  local_210.W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  local_210.W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
       = 0.0;
  local_210.W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = 1.0;
  local_210.
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._vptr_SystemModel = (_func_int **)&PTR_f_0010ec00;
  KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::
  PositionMeasurementModel
            ((PositionMeasurementModel<float,_Kalman::StandardBase> *)
             &om.
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
              .V,-10.0,-10.0,30.0,75.0);
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  .
  super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  ._vptr_MeasurementModel = (_func_int **)0x3f8000003f800000;
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  .
  super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::OrientationMeasurement<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_>)0x0;
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  .
  super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  ._12_4_ = 0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._28_8_ =
       &PTR_h_0010ed30;
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  ._16_4_ = 0x3f800000;
  local_58._M_x = 0x1b207;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  predictor.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 1.0;
  predictor.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  ekf.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 1.0;
  ekf.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  local_2e0.alpha = 1.0;
  local_2e0.beta = 2.0;
  local_2e0.kappa = 0.0;
  Kalman::UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>::computeWeights
            (&local_2e0);
  local_234 = 0x3f800000;
  uStack_22c = 0;
  local_224 = 0x3f800000;
  uStack_21c = 0;
  local_214 = 0x3f800000;
  local_198 = 0;
  predictor.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  pm.landmark2.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
  .m_storage.m_data.array =
       (Matrix<float,_2,_1>)(PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>)0x0;
  ekf.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_2e0.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_2e0.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_2e0.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  orientation.super_Vector<float,_1>.super_Matrix<float,_1,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (Vector<float,_1>)(Matrix<float,_1,_1>)0x0;
  uVar10 = 1;
  local_38 = 0.0;
  local_34 = 0.0;
  do {
    local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         1.0627905;
    local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (float)(&DAT_0010b0c0)[0x32 < uVar10];
    local_34 = local_34 +
               local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
    ;
    fVar11 = cosf(local_34);
    fVar11 = fVar11 * local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                      array[0];
    fVar12 = sinf(local_34);
    fVar12 = fVar12 * local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                      array[0];
    this = (normal_distribution<float> *)
           ((long)&ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                   super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                   super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
           0x1c);
    rVar13 = std::normal_distribution<float>::operator()(this,&local_58,(param_type *)this);
    orientation.super_Vector<float,_1>.super_Matrix<float,_1,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
         (Vector<float,_1>)
         (rVar13 * 0.1 +
         fVar11 + (float)orientation.super_Vector<float,_1>.super_Matrix<float,_1,_1>.
                         super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.
                         m_data.array[0]);
    rVar13 = std::normal_distribution<float>::operator()(this,&local_58,(param_type *)this);
    local_38 = rVar13 * 0.1 + fVar12 + local_38;
    rVar13 = std::normal_distribution<float>::operator()(this,&local_58,(param_type *)this);
    local_34 = local_34 + rVar13 * 0.1;
    pSVar8 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)&local_198,
                        &local_210,&local_4c);
    fVar11 = (pSVar8->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    fVar12 = (pSVar8->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    fVar1 = (pSVar8->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
    predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
              ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)&pm.landmark2,
               &local_210,&local_4c);
    Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
    predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
              ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)&local_2e0,
               &local_210.
                super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
               ,&local_4c);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = local_34
    ;
    rVar13 = std::normal_distribution<float>::operator()(this,&local_58,(param_type *)this);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         rVar13 * 0.025 +
         u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
    m = (MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
         *)((long)&predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                   super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                   super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
           0x1c);
    Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
    update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
              ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)&pm.landmark2,m,
               (OrientationMeasurement<float> *)&u);
    Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
    update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
              ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)&local_2e0,
               (MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
                *)m,(OrientationMeasurement<float> *)&u);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         SQRT((local_38 -
              pm.
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
              .V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
              [3]) * (local_38 -
                     pm.
                     super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                     .V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
                     .array[3]) +
              ((float)orientation.super_Vector<float,_1>.super_Matrix<float,_1,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.m_data.
                      array[0] -
              pm.
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
              .V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
              [2]) * ((float)orientation.super_Vector<float,_1>.super_Matrix<float,_1,_1>.
                             super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.
                             m_data.array[0] -
                     pm.
                     super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                     .V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
                     .array[2]));
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         SQRT((local_38 -
              pm.landmark1.super_Matrix<float,_2,_1>.
              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1])
              * (local_38 -
                pm.landmark1.super_Matrix<float,_2,_1>.
                super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
                [1]) + ((float)orientation.super_Vector<float,_1>.super_Matrix<float,_1,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage
                               .m_data.array[0] -
                       pm.landmark1.super_Matrix<float,_2,_1>.
                       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                       array[0]) *
                       ((float)orientation.super_Vector<float,_1>.super_Matrix<float,_1,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage
                               .m_data.array[0] -
                       pm.landmark1.super_Matrix<float,_2,_1>.
                       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                       array[0]));
    rVar13 = std::normal_distribution<float>::operator()(this,&local_58,(param_type *)this);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         rVar13 * 0.25 +
         u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
    rVar13 = std::normal_distribution<float>::operator()(this,&local_58,(param_type *)this);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         rVar13 * 0.25 +
         u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1];
    m_00 = &om.
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
            .V;
    pSVar8 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)&pm.landmark2,
                        (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                         *)m_00,(PositionMeasurement<float> *)&u);
    fVar2 = (pSVar8->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    fVar3 = (pSVar8->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    fVar4 = (pSVar8->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    pSVar8 = Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
                       ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)&local_2e0,
                        (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                         *)m_00,(PositionMeasurement<float> *)&u);
    fVar5 = (pSVar8->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    fVar6 = (pSVar8->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    fVar7 = (pSVar8->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    poVar9 = std::ostream::_M_insert<double>
                       ((double)(float)orientation.super_Vector<float,_1>.super_Matrix<float,_1,_1>.
                                       super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.
                                       m_storage.m_data.array[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)local_34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)fVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)fVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)fVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)fVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)fVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)fVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)fVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)fVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    poVar9 = std::ostream::_M_insert<double>((double)fVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x65);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    // Simulated (true) system state
    State x;
    x.setZero();
    
    // Control input
    Control u;
    // System
    SystemModel sys;
    
    // Measurement models
    // Set position landmarks at (-10, -10) and (30, 75)
    PositionModel pm(-10, -10, 30, 75);
    OrientationModel om;
    
    // Random number generation (for noise simulation)
    std::default_random_engine generator;
    generator.seed( 111111 );
    std::normal_distribution<T> noise(0, 1);
    
    // Some filters for estimation
    // Pure predictor without measurement updates
    Kalman::ExtendedKalmanFilter<State> predictor;
    // Extended Kalman Filter
    Kalman::ExtendedKalmanFilter<State> ekf;
    // Unscented Kalman Filter
    Kalman::UnscentedKalmanFilter<State> ukf(1);
    
    // Init filters with true system state
    predictor.init(x);
    ekf.init(x);
    ukf.init(x);
    
    // Standard-Deviation of noise added to all state vector components during state transition
    T systemNoise = 0.1;
    // Standard-Deviation of noise added to all measurement vector components in orientation measurements
    T orientationNoise = 0.025;
    // Standard-Deviation of noise added to all measurement vector components in distance measurements
    T distanceNoise = 0.25;
    
    // Simulate for 100 steps
    const size_t N = 100;
    for(size_t i = 1; i <= N; i++)
    {
        // Generate some control input
        u.v() = 1. + std::sin( T(2) * T(M_PI) / T(N) );
        u.dtheta() = std::sin( T(2) * T(M_PI) / T(N) ) * (1 - 2*(i > 50));
        
        // Simulate system
        x = sys.f(x, u);
        
        // Add noise: Our robot move is affected by noise (due to actuator failures)
        x.x() += systemNoise*noise(generator);
        x.y() += systemNoise*noise(generator);
        x.theta() += systemNoise*noise(generator);
        
        // Predict state for current time-step using the filters
        auto x_pred = predictor.predict(sys, u);
        auto x_ekf = ekf.predict(sys, u);
        auto x_ukf = ukf.predict(sys, u);
        
        // Orientation measurement
        {
            // We can measure the orientation every 5th step
            OrientationMeasurement orientation = om.h(x);
            
            // Measurement is affected by noise as well
            orientation.theta() += orientationNoise * noise(generator);
            
            // Update EKF
            x_ekf = ekf.update(om, orientation);
            
            // Update UKF
            x_ukf = ukf.update(om, orientation);
        }
        
        // Position measurement
        {
            // We can measure the position every 10th step
            PositionMeasurement position = pm.h(x);
            
            // Measurement is affected by noise as well
            position.d1() += distanceNoise * noise(generator);
            position.d2() += distanceNoise * noise(generator);
            
            // Update EKF
            x_ekf = ekf.update(pm, position);
            
            // Update UKF
            x_ukf = ukf.update(pm, position);
        }
        
        // Print to stdout as csv format
        std::cout   << x.x() << "," << x.y() << "," << x.theta() << ","
                    << x_pred.x() << "," << x_pred.y() << "," << x_pred.theta()  << ","
                    << x_ekf.x() << "," << x_ekf.y() << "," << x_ekf.theta()  << ","
                    << x_ukf.x() << "," << x_ukf.y() << "," << x_ukf.theta()
                    << std::endl;
    }
    
    return 0;
}